

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr.h
# Opt level: O2

_Bool xdr_putuint32(XDR *xdrs,uint32_t v)

{
  uint *puVar1;
  _Bool _Var2;
  
  puVar1 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar1) {
    _Var2 = (*xdrs->x_ops->x_putunit)(xdrs,v);
    return _Var2;
  }
  *(uint32_t *)xdrs->x_data = v >> 0x18 | (v & 0xff0000) >> 8 | (v & 0xff00) << 8 | v << 0x18;
  xdrs->x_data = (uint8_t *)puVar1;
  return true;
}

Assistant:

static inline bool
xdr_putuint32(XDR *xdrs, uint32_t v)
{
	uint8_t *future = xdrs->x_data + sizeof(uint32_t);

	if (future <= xdrs->x_v.vio_wrap) {
		*((int32_t *) (xdrs->x_data)) = htonl(v);
		xdrs->x_data = future;
		return (true);
	}
	return (*xdrs->x_ops->x_putunit)(xdrs, v);
}